

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall
solitaire::Solitaire::tryAddCardOnFoundationPileFromHand
          (Solitaire *this,shared_ptr<solitaire::piles::interfaces::FoundationPile> *pile)

{
  element_type *peVar1;
  reference __t;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_48 [3];
  undefined1 local_2c [8];
  optional<solitaire::cards::Card> cardToAdd;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  snapshot;
  shared_ptr<solitaire::piles::interfaces::FoundationPile> *pile_local;
  Solitaire *this_local;
  
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pile);
  (*(peVar1->super_Archiver)._vptr_Archiver[2])
            ((undefined1 *)
             ((long)&cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
                     super__Optional_payload_base<solitaire::cards::Card>._M_payload + 4));
  __t = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                  (&this->cardsInHand);
  std::optional<solitaire::cards::Card>::optional<solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)local_2c,__t);
  peVar1 = std::
           __shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pile);
  (*(peVar1->super_Archiver)._vptr_Archiver[4])(peVar1,(optional<solitaire::cards::Card> *)local_2c)
  ;
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::unique_ptr(local_48,(unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                         *)((long)&cardToAdd.
                                   super__Optional_base<solitaire::cards::Card,_true,_true>.
                                   _M_payload.super__Optional_payload_base<solitaire::cards::Card>.
                                   _M_payload + 4));
  saveHistoryIfCardMovedToOtherPileAndClearHand
            (this,(optional<solitaire::cards::Card> *)local_2c,local_48);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::~unique_ptr(local_48);
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::~unique_ptr((unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                 *)((long)&cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>.
                           _M_payload.super__Optional_payload_base<solitaire::cards::Card>.
                           _M_payload + 4));
  return;
}

Assistant:

void Solitaire::tryAddCardOnFoundationPileFromHand(std::shared_ptr<FoundationPile>& pile) {
    auto snapshot = pile->createSnapshot();
    std::optional<Card> cardToAdd {cardsInHand.back()};
    pile->tryAddCard(cardToAdd);
    saveHistoryIfCardMovedToOtherPileAndClearHand(cardToAdd, std::move(snapshot));
}